

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mnist-common.cpp
# Opt level: O0

void mnist_model_build(mnist_model *model)

{
  bool bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  long lVar4;
  undefined8 uVar5;
  long in_RDI;
  ggml_tensor *dense_in;
  ggml_tensor *conv2_out;
  ggml_tensor *conv2_in;
  ggml_tensor *conv1_out;
  ggml_tensor *images_2D;
  ggml_tensor *fc1;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                          (char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  if (bVar1) {
    ggml_set_param(*(undefined8 *)(in_RDI + 0xb8),*(undefined8 *)(in_RDI + 0x58));
    ggml_set_param(*(undefined8 *)(in_RDI + 0xb8),*(undefined8 *)(in_RDI + 0x60));
    ggml_set_param(*(undefined8 *)(in_RDI + 0xb8),*(undefined8 *)(in_RDI + 0x68));
    ggml_set_param(*(undefined8 *)(in_RDI + 0xb8),*(undefined8 *)(in_RDI + 0x70));
    uVar5 = *(undefined8 *)(in_RDI + 0xb8);
    uVar3 = *(undefined8 *)(in_RDI + 0xb8);
    uVar2 = ggml_mul_mat(*(undefined8 *)(in_RDI + 0xb8),*(undefined8 *)(in_RDI + 0x58),
                         *(undefined8 *)(in_RDI + 0x48));
    uVar3 = ggml_add(uVar3,uVar2,*(undefined8 *)(in_RDI + 0x60));
    uVar3 = ggml_relu(uVar5,uVar3);
    uVar5 = *(undefined8 *)(in_RDI + 0xb8);
    uVar3 = ggml_mul_mat(*(undefined8 *)(in_RDI + 0xb8),*(undefined8 *)(in_RDI + 0x68),uVar3);
    uVar5 = ggml_add(uVar5,uVar3,*(undefined8 *)(in_RDI + 0x70));
    *(undefined8 *)(in_RDI + 0x50) = uVar5;
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                            (char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    if (bVar1) {
      ggml_set_param(*(undefined8 *)(in_RDI + 0xb8),*(undefined8 *)(in_RDI + 0x78));
      ggml_set_param(*(undefined8 *)(in_RDI + 0xb8),*(undefined8 *)(in_RDI + 0x80));
      ggml_set_param(*(undefined8 *)(in_RDI + 0xb8),*(undefined8 *)(in_RDI + 0x88));
      ggml_set_param(*(undefined8 *)(in_RDI + 0xb8),*(undefined8 *)(in_RDI + 0x90));
      ggml_set_param(*(undefined8 *)(in_RDI + 0xb8),*(undefined8 *)(in_RDI + 0x98));
      ggml_set_param(*(undefined8 *)(in_RDI + 0xb8),*(undefined8 *)(in_RDI + 0xa0));
      uVar2 = ggml_reshape_4d(*(undefined8 *)(in_RDI + 0xb8),*(undefined8 *)(in_RDI + 0x48),0x1c,
                              0x1c,1,*(undefined8 *)(*(long *)(in_RDI + 0x48) + 0x18));
      uVar5 = *(undefined8 *)(in_RDI + 0xb8);
      uVar3 = *(undefined8 *)(in_RDI + 0xb8);
      uVar2 = ggml_conv_2d(*(undefined8 *)(in_RDI + 0xb8),*(undefined8 *)(in_RDI + 0x78),uVar2,1,1,1
                           ,1,1,1);
      uVar3 = ggml_add(uVar3,uVar2,*(undefined8 *)(in_RDI + 0x80));
      lVar4 = ggml_relu(uVar5,uVar3);
      if (*(long *)(lVar4 + 0x10) != 0x1c) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
                   ,0x151,"GGML_ASSERT(%s) failed","conv1_out->ne[0] == MNIST_HW");
      }
      if (*(long *)(lVar4 + 0x18) != 0x1c) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
                   ,0x152,"GGML_ASSERT(%s) failed","conv1_out->ne[1] == MNIST_HW");
      }
      if (*(long *)(lVar4 + 0x20) != 8) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
                   ,0x153,"GGML_ASSERT(%s) failed","conv1_out->ne[2] == MNIST_CNN_NCB");
      }
      if (*(long *)(lVar4 + 0x28) != (long)*(int *)(in_RDI + 0x44)) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
                   ,0x154,"GGML_ASSERT(%s) failed","conv1_out->ne[3] == model.nbatch_physical");
      }
      lVar4 = ggml_pool_2d(0,*(undefined8 *)(in_RDI + 0xb8),lVar4,0,2,2,2,2);
      if (*(long *)(lVar4 + 0x10) != 0xe) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
                   ,0x157,"GGML_ASSERT(%s) failed","conv2_in->ne[0] == MNIST_HW/2");
      }
      if (*(long *)(lVar4 + 0x18) != 0xe) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
                   ,0x158,"GGML_ASSERT(%s) failed","conv2_in->ne[1] == MNIST_HW/2");
      }
      if (*(long *)(lVar4 + 0x20) != 8) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
                   ,0x159,"GGML_ASSERT(%s) failed","conv2_in->ne[2] == MNIST_CNN_NCB");
      }
      if (*(long *)(lVar4 + 0x28) != (long)*(int *)(in_RDI + 0x44)) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
                   ,0x15a,"GGML_ASSERT(%s) failed","conv2_in->ne[3] == model.nbatch_physical");
      }
      uVar5 = *(undefined8 *)(in_RDI + 0xb8);
      uVar3 = *(undefined8 *)(in_RDI + 0xb8);
      uVar2 = ggml_conv_2d(*(undefined8 *)(in_RDI + 0xb8),*(undefined8 *)(in_RDI + 0x88),lVar4,1,1,1
                           ,1,1,1);
      uVar3 = ggml_add(uVar3,uVar2,*(undefined8 *)(in_RDI + 0x90));
      lVar4 = ggml_relu(uVar5,uVar3);
      if (*(long *)(lVar4 + 0x10) != 0xe) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
                   ,0x15f,"GGML_ASSERT(%s) failed","conv2_out->ne[0] == MNIST_HW/2");
      }
      if (*(long *)(lVar4 + 0x18) != 0xe) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
                   ,0x160,"GGML_ASSERT(%s) failed","conv2_out->ne[1] == MNIST_HW/2");
      }
      if (*(long *)(lVar4 + 0x20) != 0x10) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
                   ,0x161,"GGML_ASSERT(%s) failed","conv2_out->ne[2] == MNIST_CNN_NCB*2");
      }
      if (*(long *)(lVar4 + 0x28) != (long)*(int *)(in_RDI + 0x44)) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
                   ,0x162,"GGML_ASSERT(%s) failed","conv2_out->ne[3] == model.nbatch_physical");
      }
      lVar4 = ggml_pool_2d(0,*(undefined8 *)(in_RDI + 0xb8),lVar4,0,2,2,2,2);
      if (*(long *)(lVar4 + 0x10) != 7) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
                   ,0x165,"GGML_ASSERT(%s) failed","dense_in->ne[0] == MNIST_HW/4");
      }
      if (*(long *)(lVar4 + 0x18) != 7) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
                   ,0x166,"GGML_ASSERT(%s) failed","dense_in->ne[1] == MNIST_HW/4");
      }
      if (*(long *)(lVar4 + 0x20) != 0x10) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
                   ,0x167,"GGML_ASSERT(%s) failed","dense_in->ne[2] == MNIST_CNN_NCB*2");
      }
      if (*(long *)(lVar4 + 0x28) != (long)*(int *)(in_RDI + 0x44)) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
                   ,0x168,"GGML_ASSERT(%s) failed","dense_in->ne[3] == model.nbatch_physical");
      }
      uVar5 = *(undefined8 *)(in_RDI + 0xb8);
      uVar3 = *(undefined8 *)(in_RDI + 0xb8);
      uVar2 = ggml_permute(*(undefined8 *)(in_RDI + 0xb8),lVar4,1,2,0,3);
      uVar3 = ggml_cont(uVar3,uVar2);
      lVar4 = ggml_reshape_2d(uVar5,uVar3,0x310,(long)*(int *)(in_RDI + 0x44));
      if (*(long *)(lVar4 + 0x10) != 0x310) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
                   ,0x16d,"GGML_ASSERT(%s) failed",
                   "dense_in->ne[0] == (MNIST_HW/4)*(MNIST_HW/4)*(MNIST_CNN_NCB*2)");
      }
      if (*(long *)(lVar4 + 0x18) != (long)*(int *)(in_RDI + 0x44)) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
                   ,0x16e,"GGML_ASSERT(%s) failed","dense_in->ne[1] == model.nbatch_physical");
      }
      if (*(long *)(lVar4 + 0x20) != 1) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
                   ,0x16f,"GGML_ASSERT(%s) failed","dense_in->ne[2] == 1");
      }
      if (*(long *)(lVar4 + 0x28) != 1) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
                   ,0x170,"GGML_ASSERT(%s) failed","dense_in->ne[3] == 1");
      }
      uVar5 = *(undefined8 *)(in_RDI + 0xb8);
      uVar3 = ggml_mul_mat(*(undefined8 *)(in_RDI + 0xb8),*(undefined8 *)(in_RDI + 0x98),lVar4);
      uVar5 = ggml_add(uVar5,uVar3,*(undefined8 *)(in_RDI + 0xa0));
      *(undefined8 *)(in_RDI + 0x50) = uVar5;
    }
    else {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
                 ,0x174,"GGML_ASSERT(%s) failed","false");
    }
  }
  ggml_set_name(*(undefined8 *)(in_RDI + 0x50),"logits");
  ggml_set_output(*(undefined8 *)(in_RDI + 0x50));
  if (**(int **)(in_RDI + 0x50) != 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
               ,0x179,"GGML_ASSERT(%s) failed","model.logits->type == GGML_TYPE_F32");
  }
  if (*(long *)(*(long *)(in_RDI + 0x50) + 0x10) != 10) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
               ,0x17a,"GGML_ASSERT(%s) failed","model.logits->ne[0] == MNIST_NCLASSES");
  }
  if (*(long *)(*(long *)(in_RDI + 0x50) + 0x18) != (long)*(int *)(in_RDI + 0x44)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
               ,0x17b,"GGML_ASSERT(%s) failed","model.logits->ne[1] == model.nbatch_physical");
  }
  if (*(long *)(*(long *)(in_RDI + 0x50) + 0x20) != 1) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
               ,0x17c,"GGML_ASSERT(%s) failed","model.logits->ne[2] == 1");
  }
  if (*(long *)(*(long *)(in_RDI + 0x50) + 0x28) != 1) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
               ,0x17d,"GGML_ASSERT(%s) failed","model.logits->ne[3] == 1");
  }
  return;
}

Assistant:

void mnist_model_build(mnist_model & model) {
    if (model.arch == "mnist-fc") {
        ggml_set_param(model.ctx_compute, model.fc1_weight);
        ggml_set_param(model.ctx_compute, model.fc1_bias);
        ggml_set_param(model.ctx_compute, model.fc2_weight);
        ggml_set_param(model.ctx_compute, model.fc2_bias);

        ggml_tensor * fc1 = ggml_relu(model.ctx_compute, ggml_add(model.ctx_compute,
            ggml_mul_mat(model.ctx_compute, model.fc1_weight, model.images),
            model.fc1_bias));
        model.logits = ggml_add(model.ctx_compute,
            ggml_mul_mat(model.ctx_compute, model.fc2_weight, fc1),
            model.fc2_bias);
    } else if (model.arch == "mnist-cnn") {
        ggml_set_param(model.ctx_compute, model.conv1_kernel);
        ggml_set_param(model.ctx_compute, model.conv1_bias);
        ggml_set_param(model.ctx_compute, model.conv2_kernel);
        ggml_set_param(model.ctx_compute, model.conv2_bias);
        ggml_set_param(model.ctx_compute, model.dense_weight);
        ggml_set_param(model.ctx_compute, model.dense_bias);

        struct ggml_tensor * images_2D = ggml_reshape_4d(model.ctx_compute, model.images, MNIST_HW, MNIST_HW, 1, model.images->ne[1]);

        struct ggml_tensor * conv1_out = ggml_relu(model.ctx_compute, ggml_add(model.ctx_compute,
            ggml_conv_2d(model.ctx_compute, model.conv1_kernel, images_2D, 1, 1, 1, 1, 1, 1),
            model.conv1_bias));
        GGML_ASSERT(conv1_out->ne[0] == MNIST_HW);
        GGML_ASSERT(conv1_out->ne[1] == MNIST_HW);
        GGML_ASSERT(conv1_out->ne[2] == MNIST_CNN_NCB);
        GGML_ASSERT(conv1_out->ne[3] == model.nbatch_physical);

        struct ggml_tensor * conv2_in = ggml_pool_2d(model.ctx_compute, conv1_out, GGML_OP_POOL_MAX, 2, 2, 2, 2, 0, 0);
        GGML_ASSERT(conv2_in->ne[0] == MNIST_HW/2);
        GGML_ASSERT(conv2_in->ne[1] == MNIST_HW/2);
        GGML_ASSERT(conv2_in->ne[2] == MNIST_CNN_NCB);
        GGML_ASSERT(conv2_in->ne[3] == model.nbatch_physical);

        struct ggml_tensor * conv2_out = ggml_relu(model.ctx_compute, ggml_add(model.ctx_compute,
            ggml_conv_2d(model.ctx_compute, model.conv2_kernel, conv2_in, 1, 1, 1, 1, 1, 1),
            model.conv2_bias));
        GGML_ASSERT(conv2_out->ne[0] == MNIST_HW/2);
        GGML_ASSERT(conv2_out->ne[1] == MNIST_HW/2);
        GGML_ASSERT(conv2_out->ne[2] == MNIST_CNN_NCB*2);
        GGML_ASSERT(conv2_out->ne[3] == model.nbatch_physical);

        struct ggml_tensor * dense_in = ggml_pool_2d(model.ctx_compute, conv2_out, GGML_OP_POOL_MAX, 2, 2, 2, 2, 0, 0);
        GGML_ASSERT(dense_in->ne[0] == MNIST_HW/4);
        GGML_ASSERT(dense_in->ne[1] == MNIST_HW/4);
        GGML_ASSERT(dense_in->ne[2] == MNIST_CNN_NCB*2);
        GGML_ASSERT(dense_in->ne[3] == model.nbatch_physical);

        dense_in = ggml_reshape_2d(model.ctx_compute,
            ggml_cont(model.ctx_compute, ggml_permute(model.ctx_compute, dense_in, 1, 2, 0, 3)),
            (MNIST_HW/4)*(MNIST_HW/4)*(MNIST_CNN_NCB*2), model.nbatch_physical);
        GGML_ASSERT(dense_in->ne[0] == (MNIST_HW/4)*(MNIST_HW/4)*(MNIST_CNN_NCB*2));
        GGML_ASSERT(dense_in->ne[1] == model.nbatch_physical);
        GGML_ASSERT(dense_in->ne[2] == 1);
        GGML_ASSERT(dense_in->ne[3] == 1);

        model.logits = ggml_add(model.ctx_compute, ggml_mul_mat(model.ctx_compute, model.dense_weight, dense_in), model.dense_bias);
    } else {
        GGML_ASSERT(false);
    }

    ggml_set_name(model.logits, "logits");
    ggml_set_output(model.logits);
    GGML_ASSERT(model.logits->type == GGML_TYPE_F32);
    GGML_ASSERT(model.logits->ne[0] == MNIST_NCLASSES);
    GGML_ASSERT(model.logits->ne[1] == model.nbatch_physical);
    GGML_ASSERT(model.logits->ne[2] == 1);
    GGML_ASSERT(model.logits->ne[3] == 1);
}